

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O1

void avro::codec_traits<testgen_r::Nested>::decode(Decoder *d,Nested *v)

{
  unsigned_long uVar1;
  int32_t iVar2;
  long *plVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer puVar4;
  double dVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  plVar3 = (long *)__dynamic_cast(d,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  if (plVar3 == (long *)0x0) {
    codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    decode(d,&v->inval2);
    dVar5 = (double)(**(code **)(*(long *)d + 0x40))(d);
    v->inval1 = dVar5;
    iVar2 = (**(code **)(*(long *)d + 0x28))(d);
    v->inval3 = iVar2;
  }
  else {
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          (**(code **)(*plVar3 + 0xb8))(plVar3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__x);
    puVar4 = local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        uVar1 = *puVar4;
        if (uVar1 == 2) {
          iVar2 = (**(code **)(*(long *)d + 0x28))(d);
          v->inval3 = iVar2;
        }
        else if (uVar1 == 1) {
          dVar5 = (double)(**(code **)(*(long *)d + 0x40))(d);
          v->inval1 = dVar5;
        }
        else if (uVar1 == 0) {
          codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(d,&v->inval2);
        }
        puVar4 = puVar4 + 1;
      } while (puVar4 != local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

static void decode(Decoder& d, testgen_r::Nested& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.inval2);
                    break;
                case 1:
                    avro::decode(d, v.inval1);
                    break;
                case 2:
                    avro::decode(d, v.inval3);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.inval2);
            avro::decode(d, v.inval1);
            avro::decode(d, v.inval3);
        }
    }